

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

FileDescriptor * unshield_get_file_descriptor(Unshield *unshield,int index)

{
  Header *pHVar1;
  FileDescriptor **ppFVar2;
  FileDescriptor *pFVar3;
  Header *header;
  int index_local;
  Unshield *unshield_local;
  
  pHVar1 = unshield->header_list;
  if ((index < 0) || ((int)(pHVar1->cab).file_count <= index)) {
    _unshield_log(1,"unshield_get_file_descriptor",0x97,"Invalid index");
    unshield_local = (Unshield *)0x0;
  }
  else {
    if (pHVar1->file_descriptors == (FileDescriptor **)0x0) {
      ppFVar2 = (FileDescriptor **)calloc((ulong)(pHVar1->cab).file_count,8);
      pHVar1->file_descriptors = ppFVar2;
    }
    if (pHVar1->file_descriptors[index] == (FileDescriptor *)0x0) {
      pFVar3 = unshield_read_file_descriptor(unshield,index);
      pHVar1->file_descriptors[index] = pFVar3;
    }
    unshield_local = (Unshield *)pHVar1->file_descriptors[index];
  }
  return (FileDescriptor *)unshield_local;
}

Assistant:

static FileDescriptor* unshield_get_file_descriptor(Unshield* unshield, int index)
{
  /* XXX: multi-volume support... */
  Header* header = unshield->header_list;

  if (index < 0 || index >= (int)header->cab.file_count)
  {
    unshield_error("Invalid index");
    return NULL;
  }

  if (!header->file_descriptors)
    header->file_descriptors = calloc(header->cab.file_count, sizeof(FileDescriptor*));

  if (!header->file_descriptors[index])
    header->file_descriptors[index] = unshield_read_file_descriptor(unshield, index);

  return header->file_descriptors[index];
}